

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Card.cpp
# Opt level: O0

void __thiscall Card::Card(Card *this,string *n,int t)

{
  int t_local;
  string *n_local;
  Card *this_local;
  
  this->_vptr_Card = (_func_int **)&PTR_effectBonus_0012b118;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::operator=((string *)&this->name,(string *)n);
  this->tapped = false;
  this->type = t;
  return;
}

Assistant:

Card::Card(string n, int t)
{
    name = n;
    tapped = false;
    type = Type(t);
}